

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegCheckCharacterRange
              (xmlRegAtomType type,int codepoint,int neg,int start,int end,xmlChar *blockName)

{
  int iVar1;
  uint uVar2;
  undefined4 in_register_00000084;
  bool bVar3;
  bool bVar4;
  
  switch(type) {
  case XML_REGEXP_LETTER:
    iVar1 = xmlUCSIsCatL(codepoint);
    return iVar1;
  case XML_REGEXP_LETTER_UPPERCASE:
    iVar1 = xmlUCSIsCatLu(codepoint);
    return iVar1;
  case XML_REGEXP_LETTER_LOWERCASE:
    iVar1 = xmlUCSIsCatLl(codepoint);
    return iVar1;
  case XML_REGEXP_LETTER_TITLECASE:
    iVar1 = xmlUCSIsCatLt(codepoint);
    return iVar1;
  case XML_REGEXP_LETTER_MODIFIER:
    iVar1 = xmlUCSIsCatLm(codepoint);
    return iVar1;
  case XML_REGEXP_LETTER_OTHERS:
    iVar1 = xmlUCSIsCatLo(codepoint);
    return iVar1;
  case XML_REGEXP_MARK:
    iVar1 = xmlUCSIsCatM(codepoint);
    return iVar1;
  case XML_REGEXP_MARK_NONSPACING:
    iVar1 = xmlUCSIsCatMn(codepoint);
    return iVar1;
  case XML_REGEXP_MARK_SPACECOMBINING:
    iVar1 = xmlUCSIsCatMc(codepoint);
    return iVar1;
  case XML_REGEXP_MARK_ENCLOSING:
    iVar1 = xmlUCSIsCatMe(codepoint);
    return iVar1;
  case XML_REGEXP_NUMBER:
    iVar1 = xmlUCSIsCatN(codepoint);
    return iVar1;
  case XML_REGEXP_NUMBER_DECIMAL:
    iVar1 = xmlUCSIsCatNd(codepoint);
    return iVar1;
  case XML_REGEXP_NUMBER_LETTER:
    iVar1 = xmlUCSIsCatNl(codepoint);
    return iVar1;
  case XML_REGEXP_NUMBER_OTHERS:
    iVar1 = xmlUCSIsCatNo(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT:
    iVar1 = xmlUCSIsCatP(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_CONNECTOR:
    iVar1 = xmlUCSIsCatPc(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_DASH:
    iVar1 = xmlUCSIsCatPd(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_OPEN:
    iVar1 = xmlUCSIsCatPs(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_CLOSE:
    iVar1 = xmlUCSIsCatPe(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_INITQUOTE:
    iVar1 = xmlUCSIsCatPi(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_FINQUOTE:
    iVar1 = xmlUCSIsCatPf(codepoint);
    return iVar1;
  case XML_REGEXP_PUNCT_OTHERS:
    iVar1 = xmlUCSIsCatPo(codepoint);
    return iVar1;
  case XML_REGEXP_SEPAR:
    iVar1 = xmlUCSIsCatZ(codepoint);
    return iVar1;
  case XML_REGEXP_SEPAR_SPACE:
    iVar1 = xmlUCSIsCatZs(codepoint);
    return iVar1;
  case XML_REGEXP_SEPAR_LINE:
    iVar1 = xmlUCSIsCatZl(codepoint);
    return iVar1;
  case XML_REGEXP_SEPAR_PARA:
    iVar1 = xmlUCSIsCatZp(codepoint);
    return iVar1;
  case XML_REGEXP_SYMBOL:
    iVar1 = xmlUCSIsCatS(codepoint);
    return iVar1;
  case XML_REGEXP_SYMBOL_MATH:
    iVar1 = xmlUCSIsCatSm(codepoint);
    return iVar1;
  case XML_REGEXP_SYMBOL_CURRENCY:
    iVar1 = xmlUCSIsCatSc(codepoint);
    return iVar1;
  case XML_REGEXP_SYMBOL_MODIFIER:
    iVar1 = xmlUCSIsCatSk(codepoint);
    return iVar1;
  case XML_REGEXP_SYMBOL_OTHERS:
    iVar1 = xmlUCSIsCatSo(codepoint);
    return iVar1;
  case XML_REGEXP_OTHER:
    iVar1 = xmlUCSIsCatC(codepoint);
    return iVar1;
  case XML_REGEXP_OTHER_CONTROL:
    iVar1 = xmlUCSIsCatCc(codepoint);
    return iVar1;
  case XML_REGEXP_OTHER_FORMAT:
    iVar1 = xmlUCSIsCatCf(codepoint);
    return iVar1;
  case XML_REGEXP_OTHER_PRIVATE:
    iVar1 = xmlUCSIsCatCo(codepoint);
    return iVar1;
  case XML_REGEXP_OTHER_NA:
LAB_001ac1b1:
    return 0;
  case XML_REGEXP_BLOCK_NAME:
    iVar1 = xmlUCSIsBlock(codepoint,(char *)CONCAT44(in_register_00000084,end));
    return iVar1;
  }
  bVar4 = false;
  bVar3 = false;
  switch(type) {
  case XML_REGEXP_EPSILON:
  case XML_REGEXP_RANGES:
  case XML_REGEXP_SUBREG:
  case XML_REGEXP_STRING:
    return -1;
  case XML_REGEXP_CHARVAL:
    bVar4 = neg <= codepoint;
    bVar3 = codepoint <= start;
    goto LAB_001ac18d;
  case XML_REGEXP_ANYCHAR:
    bVar4 = codepoint != 10;
    bVar3 = codepoint != 0xd;
LAB_001ac18d:
    return (uint)(byte)(bVar3 & bVar4);
  case XML_REGEXP_ANYSPACE:
    goto switchD_001abde3_caseD_7;
  case XML_REGEXP_NOTSPACE:
    bVar4 = true;
switchD_001abde3_caseD_7:
    if ((0xd < (uint)codepoint) || (uVar2 = 1, (0x2600U >> (codepoint & 0x1fU) & 1) == 0)) {
      bVar3 = codepoint == 0x20;
LAB_001ac17b:
      uVar2 = (uint)bVar3;
    }
LAB_001ac1a3:
    if (!bVar4) {
      return uVar2;
    }
    return (uint)(uVar2 == 0);
  case XML_REGEXP_INITNAME:
    goto switchD_001abde3_caseD_9;
  case XML_REGEXP_NOTINITNAME:
    bVar4 = true;
switchD_001abde3_caseD_9:
    if (codepoint < 0x100) {
      uVar2 = 1;
      if ((((codepoint - 0xc0U < 0x17) || ((codepoint & 0xffffffdfU) - 0x41 < 0x1a)) ||
          (codepoint == 0x5f)) || ((0xf7 < codepoint || (codepoint - 0xd8U < 0x1f))))
      goto LAB_001ac1a3;
    }
    else {
      iVar1 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
      uVar2 = 1;
      if ((iVar1 != 0) ||
         ((codepoint - 0x3021U < 9 || codepoint - 0x4e00U < 0x51a6) || codepoint == 0x3007))
      goto LAB_001ac1a3;
    }
    bVar3 = codepoint == 0x3a;
    goto LAB_001ac17b;
  case XML_REGEXP_NAMECHAR:
    goto switchD_001abde3_caseD_b;
  case XML_REGEXP_NOTNAMECHAR:
    bVar3 = true;
switchD_001abde3_caseD_b:
    bVar4 = bVar3;
    if (codepoint < 0x100) {
      uVar2 = 1;
      if (((codepoint - 0xc0U < 0x17) || ((codepoint & 0xffffffdfU) - 0x41 < 0x1a)) ||
         ((codepoint - 0x30U < 10 || ((0xf7 < codepoint || (codepoint - 0xd8U < 0x1f))))))
      goto LAB_001ac1a3;
    }
    else {
      iVar1 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
      uVar2 = 1;
      if (((iVar1 != 0) ||
          ((codepoint - 0x3021U < 9 || codepoint - 0x4e00U < 0x51a6) || codepoint == 0x3007)) ||
         (iVar1 = xmlCharInRange(codepoint,&xmlIsDigitGroup), iVar1 != 0)) goto LAB_001ac1a3;
    }
    uVar2 = 1;
    if ((0x32 < codepoint - 0x2dU) ||
       ((0x4000000002003U >> ((ulong)(codepoint - 0x2dU) & 0x3f) & 1) == 0)) {
      if (codepoint < 0x100) {
        bVar3 = codepoint == 0xb7;
      }
      else {
        iVar1 = xmlCharInRange(codepoint,&xmlIsCombiningGroup);
        if (iVar1 != 0) goto LAB_001ac1a3;
        iVar1 = xmlCharInRange(codepoint,&xmlIsExtenderGroup);
        bVar3 = iVar1 != 0;
      }
      uVar2 = (uint)bVar3;
    }
    goto LAB_001ac1a3;
  case XML_REGEXP_DECIMAL:
    goto switchD_001abde3_caseD_d;
  case XML_REGEXP_NOTDECIMAL:
    bVar4 = true;
switchD_001abde3_caseD_d:
    uVar2 = xmlUCSIsCatNd(codepoint);
    goto LAB_001ac1a3;
  case XML_REGEXP_REALCHAR:
    bVar4 = true;
  case XML_REGEXP_NOTREALCHAR:
    uVar2 = xmlUCSIsCatP(codepoint);
    if ((uVar2 == 0) && (uVar2 = xmlUCSIsCatZ(codepoint), uVar2 == 0)) {
      uVar2 = xmlUCSIsCatC(codepoint);
    }
    goto LAB_001ac1a3;
  default:
    goto LAB_001ac1b1;
  }
}

Assistant:

static int
xmlRegCheckCharacterRange(xmlRegAtomType type, int codepoint, int neg,
	                  int start, int end, const xmlChar *blockName) {
    int ret = 0;

    switch (type) {
        case XML_REGEXP_STRING:
        case XML_REGEXP_SUBREG:
        case XML_REGEXP_RANGES:
        case XML_REGEXP_EPSILON:
	    return(-1);
        case XML_REGEXP_ANYCHAR:
	    ret = ((codepoint != '\n') && (codepoint != '\r'));
	    break;
        case XML_REGEXP_CHARVAL:
	    ret = ((codepoint >= start) && (codepoint <= end));
	    break;
        case XML_REGEXP_NOTSPACE:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_ANYSPACE:
	    ret = ((codepoint == '\n') || (codepoint == '\r') ||
		   (codepoint == '\t') || (codepoint == ' '));
	    break;
        case XML_REGEXP_NOTINITNAME:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_INITNAME:
	    ret = (IS_LETTER(codepoint) ||
		   (codepoint == '_') || (codepoint == ':'));
	    break;
        case XML_REGEXP_NOTNAMECHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NAMECHAR:
	    ret = (IS_LETTER(codepoint) || IS_DIGIT(codepoint) ||
		   (codepoint == '.') || (codepoint == '-') ||
		   (codepoint == '_') || (codepoint == ':') ||
		   IS_COMBINING(codepoint) || IS_EXTENDER(codepoint));
	    break;
        case XML_REGEXP_NOTDECIMAL:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_REALCHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NOTREALCHAR:
	    ret = xmlUCSIsCatP(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatZ(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_LETTER:
	    ret = xmlUCSIsCatL(codepoint);
	    break;
        case XML_REGEXP_LETTER_UPPERCASE:
	    ret = xmlUCSIsCatLu(codepoint);
	    break;
        case XML_REGEXP_LETTER_LOWERCASE:
	    ret = xmlUCSIsCatLl(codepoint);
	    break;
        case XML_REGEXP_LETTER_TITLECASE:
	    ret = xmlUCSIsCatLt(codepoint);
	    break;
        case XML_REGEXP_LETTER_MODIFIER:
	    ret = xmlUCSIsCatLm(codepoint);
	    break;
        case XML_REGEXP_LETTER_OTHERS:
	    ret = xmlUCSIsCatLo(codepoint);
	    break;
        case XML_REGEXP_MARK:
	    ret = xmlUCSIsCatM(codepoint);
	    break;
        case XML_REGEXP_MARK_NONSPACING:
	    ret = xmlUCSIsCatMn(codepoint);
	    break;
        case XML_REGEXP_MARK_SPACECOMBINING:
	    ret = xmlUCSIsCatMc(codepoint);
	    break;
        case XML_REGEXP_MARK_ENCLOSING:
	    ret = xmlUCSIsCatMe(codepoint);
	    break;
        case XML_REGEXP_NUMBER:
	    ret = xmlUCSIsCatN(codepoint);
	    break;
        case XML_REGEXP_NUMBER_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_NUMBER_LETTER:
	    ret = xmlUCSIsCatNl(codepoint);
	    break;
        case XML_REGEXP_NUMBER_OTHERS:
	    ret = xmlUCSIsCatNo(codepoint);
	    break;
        case XML_REGEXP_PUNCT:
	    ret = xmlUCSIsCatP(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CONNECTOR:
	    ret = xmlUCSIsCatPc(codepoint);
	    break;
        case XML_REGEXP_PUNCT_DASH:
	    ret = xmlUCSIsCatPd(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OPEN:
	    ret = xmlUCSIsCatPs(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CLOSE:
	    ret = xmlUCSIsCatPe(codepoint);
	    break;
        case XML_REGEXP_PUNCT_INITQUOTE:
	    ret = xmlUCSIsCatPi(codepoint);
	    break;
        case XML_REGEXP_PUNCT_FINQUOTE:
	    ret = xmlUCSIsCatPf(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OTHERS:
	    ret = xmlUCSIsCatPo(codepoint);
	    break;
        case XML_REGEXP_SEPAR:
	    ret = xmlUCSIsCatZ(codepoint);
	    break;
        case XML_REGEXP_SEPAR_SPACE:
	    ret = xmlUCSIsCatZs(codepoint);
	    break;
        case XML_REGEXP_SEPAR_LINE:
	    ret = xmlUCSIsCatZl(codepoint);
	    break;
        case XML_REGEXP_SEPAR_PARA:
	    ret = xmlUCSIsCatZp(codepoint);
	    break;
        case XML_REGEXP_SYMBOL:
	    ret = xmlUCSIsCatS(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MATH:
	    ret = xmlUCSIsCatSm(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_CURRENCY:
	    ret = xmlUCSIsCatSc(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MODIFIER:
	    ret = xmlUCSIsCatSk(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_OTHERS:
	    ret = xmlUCSIsCatSo(codepoint);
	    break;
        case XML_REGEXP_OTHER:
	    ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_OTHER_CONTROL:
	    ret = xmlUCSIsCatCc(codepoint);
	    break;
        case XML_REGEXP_OTHER_FORMAT:
	    ret = xmlUCSIsCatCf(codepoint);
	    break;
        case XML_REGEXP_OTHER_PRIVATE:
	    ret = xmlUCSIsCatCo(codepoint);
	    break;
        case XML_REGEXP_OTHER_NA:
	    /* ret = xmlUCSIsCatCn(codepoint); */
	    /* Seems it doesn't exist anymore in recent Unicode releases */
	    ret = 0;
	    break;
        case XML_REGEXP_BLOCK_NAME:
	    ret = xmlUCSIsBlock(codepoint, (const char *) blockName);
	    break;
    }
    if (neg)
	return(!ret);
    return(ret);
}